

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void musig_nonce_bitflip(uchar **args,size_t n_flip,size_t n_bytes)

{
  int iVar1;
  long in_RDI;
  secp256k1_scalar k2 [2];
  secp256k1_scalar k1 [2];
  uchar *in_stack_000000b0;
  secp256k1_scalar *b;
  secp256k1_scalar *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  uchar *in_stack_ffffffffffffff70;
  
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)args,(uchar *)n_flip,(uchar *)n_bytes,(uchar *)k1[1].d[3],
             (uchar *)k1[1].d[2],(uchar *)k1[1].d[1],in_stack_000000b0);
  testrand_flip(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  b = *(secp256k1_scalar **)(in_RDI + 0x28);
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)args,(uchar *)n_flip,(uchar *)n_bytes,(uchar *)k1[1].d[3],
             (uchar *)k1[1].d[2],(uchar *)k1[1].d[1],in_stack_000000b0);
  iVar1 = secp256k1_scalar_eq(in_stack_ffffffffffffff60,b);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x1ec,"test condition failed: secp256k1_scalar_eq(&k1[0], &k2[0]) == 0");
    abort();
  }
  iVar1 = secp256k1_scalar_eq(in_stack_ffffffffffffff60,b);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x1ed,"test condition failed: secp256k1_scalar_eq(&k1[1], &k2[1]) == 0");
    abort();
  }
  return;
}

Assistant:

static void musig_nonce_bitflip(unsigned char **args, size_t n_flip, size_t n_bytes) {
    secp256k1_scalar k1[2], k2[2];

    secp256k1_nonce_function_musig(k1, args[0], args[1], args[2], args[3], args[4], args[5]);
    testrand_flip(args[n_flip], n_bytes);
    secp256k1_nonce_function_musig(k2, args[0], args[1], args[2], args[3], args[4], args[5]);
    CHECK(secp256k1_scalar_eq(&k1[0], &k2[0]) == 0);
    CHECK(secp256k1_scalar_eq(&k1[1], &k2[1]) == 0);
}